

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# d1_lib.cc
# Opt level: O0

int DTLSv1_get_timeout(SSL *ssl,timeval *out)

{
  ulong uVar1;
  int iVar2;
  pointer ctx;
  unsigned_long *puVar3;
  OPENSSL_timeval OVar4;
  OPENSSL_timeval now_00;
  long kTvSecMax;
  uint64_t remaining_sec;
  uint64_t local_50;
  uint64_t local_48;
  uint32_t local_40;
  uint64_t local_38;
  uint64_t remaining_usec;
  OPENSSL_timeval now;
  timeval *out_local;
  SSL *ssl_local;
  
  now._8_8_ = out;
  iVar2 = SSL_is_dtls(ssl);
  if (iVar2 == 0) {
    ssl_local._4_4_ = 0;
  }
  else {
    ctx = std::unique_ptr<ssl_ctx_st,_bssl::internal::Deleter>::get(&ssl->ctx);
    OVar4 = bssl::ssl_ctx_get_current_time(ctx);
    local_48 = OVar4.tv_sec;
    local_40 = OVar4.tv_usec;
    now_00._12_4_ = 0;
    now_00.tv_sec = SUB128(OVar4._0_12_,0);
    now_00.tv_usec = SUB124(OVar4._0_12_,8);
    remaining_usec = local_48;
    now.tv_sec._0_4_ = local_40;
    local_38 = bssl::DTLSTimer::MicrosecondsRemaining(&ssl->d1->retransmit_timer,now_00);
    OVar4.tv_usec = (uint32_t)now.tv_sec;
    OVar4.tv_sec = remaining_usec;
    OVar4._12_4_ = 0;
    local_50 = bssl::DTLSTimer::MicrosecondsRemaining(&ssl->d1->ack_timer,OVar4);
    puVar3 = std::min<unsigned_long>(&local_38,&local_50);
    uVar1 = *puVar3;
    if (uVar1 == 0xffffffffffffffff) {
      ssl_local._4_4_ = 0;
    }
    else {
      if (uVar1 / 1000000 < 0x8000000000000000) {
        *(ulong *)now._8_8_ = uVar1 / 1000000;
      }
      else {
        *(undefined8 *)now._8_8_ = 0x7fffffffffffffff;
        *(undefined8 *)(now._8_8_ + 8) = 999999;
      }
      *(ulong *)(now._8_8_ + 8) = uVar1 % 1000000;
      ssl_local._4_4_ = 1;
    }
  }
  return ssl_local._4_4_;
}

Assistant:

int DTLSv1_get_timeout(const SSL *ssl, struct timeval *out) {
  if (!SSL_is_dtls(ssl)) {
    return 0;
  }

  OPENSSL_timeval now = ssl_ctx_get_current_time(ssl->ctx.get());
  uint64_t remaining_usec =
      ssl->d1->retransmit_timer.MicrosecondsRemaining(now);
  remaining_usec =
      std::min(remaining_usec, ssl->d1->ack_timer.MicrosecondsRemaining(now));
  if (remaining_usec == DTLSTimer::kNever) {
    return 0;  // No timeout is set.
  }

  uint64_t remaining_sec = remaining_usec / 1000000;
  remaining_usec %= 1000000;

  // |timeval| uses |time_t|, which may be 32-bit.
  const auto kTvSecMax = std::numeric_limits<decltype(out->tv_sec)>::max();
  if (remaining_sec > static_cast<uint64_t>(kTvSecMax)) {
    out->tv_sec = kTvSecMax;  // Saturate the output.
    out->tv_usec = 999999;
  } else {
    out->tv_sec = static_cast<decltype(out->tv_sec)>(remaining_sec);
  }
  out->tv_usec = remaining_usec;
  return 1;
}